

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O3

void idx2::InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>
               (t2<unsigned_int,_idx2::channel_*> *Beg,t2<unsigned_int,_idx2::channel_*> *End)

{
  t2<unsigned_int,_idx2::channel_*> *ptVar1;
  channel *pcVar2;
  channel *pcVar3;
  t2<unsigned_int,_idx2::channel_*> *ptVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  t2<unsigned_int,_idx2::channel_*> *ptVar8;
  t2<unsigned_int,_idx2::channel_*> *ptVar9;
  t2<unsigned_int,_idx2::channel_*> *ptVar10;
  
  ptVar8 = Beg + 1;
  if (ptVar8 != End && Beg != End) {
    do {
      ptVar9 = ptVar8;
      ptVar10 = Beg;
      while (ptVar4 = ptVar8, ptVar10 < ptVar9) {
        while( true ) {
          ptVar1 = (t2<unsigned_int,_idx2::channel_*> *)
                   (&ptVar10->First +
                   (((long)ptVar9 - (long)ptVar10 >> 4) - ((long)ptVar9 - (long)ptVar10 >> 0x3f) &
                   0xfffffffffffffffeU) * 2);
          if (ptVar8->First <= ptVar1->First) break;
          ptVar10 = ptVar1 + 1;
          if (ptVar9 <= ptVar10) goto joined_r0x0019a158;
        }
        ptVar9 = ptVar1;
        if (ptVar1->First <= ptVar8->First) break;
      }
joined_r0x0019a158:
      for (; ptVar4 != ptVar9; ptVar4 = ptVar4 + -1) {
        uVar6 = ptVar4->First;
        uVar7 = *(undefined4 *)&ptVar4->field_0x4;
        pcVar2 = ptVar4->Second;
        uVar5 = *(undefined4 *)&ptVar4[-1].field_0x4;
        pcVar3 = ptVar4[-1].Second;
        ptVar4->First = ptVar4[-1].First;
        *(undefined4 *)&ptVar4->field_0x4 = uVar5;
        ptVar4->Second = pcVar3;
        ptVar4[-1].First = uVar6;
        *(undefined4 *)&ptVar4[-1].field_0x4 = uVar7;
        ptVar4[-1].Second = pcVar2;
      }
      ptVar8 = ptVar8 + 1;
    } while (ptVar8 != End);
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}